

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation.cc
# Opt level: O0

bool __thiscall
sptk::InputSourceInterpolation::Get
          (InputSourceInterpolation *this,vector<double,_std::allocator<double>_> *buffer)

{
  size_type sVar1;
  ulong uVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff58;
  bool local_1;
  
  if ((in_RSI == (vector<double,_std::allocator<double>_> *)0x0) ||
     ((*(byte *)(in_RDI + 0x30) & 1) == 0)) {
    local_1 = false;
  }
  else if (*(int *)(in_RDI + 0x18) < 1) {
    local_1 = false;
  }
  else {
    sVar1 = ::std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar1 != (long)*(int *)(in_RDI + 0x1c)) {
      ::std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50._M_current,
                 (size_type)in_stack_ffffffffffffff48._M_current);
    }
    ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
    ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff28);
    ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
    ::std::
    copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + -1;
    if (*(int *)(in_RDI + 0x18) < 1) {
      if ((*(byte *)(in_RDI + 0x14) & 1) != 0) {
        *(undefined4 *)(in_RDI + 0x18) = 1;
      }
      local_1 = true;
    }
    else {
      *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
      if (*(int *)(in_RDI + 0x20) % *(int *)(in_RDI + 8) == 0) {
        ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
        ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff28);
        ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
        ::std::
        copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        uVar2 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x20))
                          (*(long **)(in_RDI + 0x28),in_RDI + 0x50);
        if ((uVar2 & 1) == 0) {
          ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
          ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff28);
          ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
          ::std::
          copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          *(undefined4 *)(in_RDI + 0x18) = 1;
        }
        else {
          *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 8) + 1;
        }
        if (0 < *(int *)(in_RDI + 0xc)) {
          CalculateIncrement((InputSourceInterpolation *)in_stack_ffffffffffffff50._M_current);
        }
        *(undefined4 *)(in_RDI + 0x20) = 0;
      }
      else if ((*(int *)(in_RDI + 0xc) < 1) ||
              ((*(int *)(in_RDI + 0x20) + *(int *)(in_RDI + 0x10)) % *(int *)(in_RDI + 0xc) != 0)) {
        if ((*(int *)(in_RDI + 0xc) == 0) && (*(int *)(in_RDI + 8) / 2 == *(int *)(in_RDI + 0x20)))
        {
          iVar3 = ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
          iVar4 = ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff28);
          ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
          ::std::
          copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (in_stack_ffffffffffffff58,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar3._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar4._M_current);
        }
      }
      else {
        iVar3 = ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
        iVar4 = ::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff28);
        iVar5 = ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
        iVar6 = ::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
        ::std::
        transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
                  (iVar3._M_current,iVar4._M_current,iVar5._M_current,iVar6._M_current);
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool InputSourceInterpolation::Get(std::vector<double>* buffer) {
  if (NULL == buffer || !is_valid_) {
    return false;
  }

  if (remained_num_samples_ <= 0) {
    return false;
  }

  if (buffer->size() != static_cast<std::size_t>(data_length_)) {
    buffer->resize(data_length_);
  }

  std::copy(curr_data_.begin(), curr_data_.end(), buffer->begin());

  --remained_num_samples_;

  if (remained_num_samples_ <= 0) {
    if (use_final_frame_for_exceeded_frame_) {
      remained_num_samples_ = 1;
    }
    return true;
  }

  // Update internal states for the next call.
  ++point_index_in_frame_;

  if (0 == point_index_in_frame_ % frame_period_) {
    // Update current and next data.
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
    if (!source_->Get(&next_data_)) {
      // Use the final data until the end of input sequence.
      std::copy(curr_data_.begin(), curr_data_.end(), next_data_.begin());
      remained_num_samples_ = 1;
    } else {
      remained_num_samples_ = frame_period_ + 1;
    }

    if (0 < interpolation_period_) {
      CalculateIncrement();
    }

    // Rewind point index.
    point_index_in_frame_ = 0;
  } else if (0 < interpolation_period_ &&
             0 == ((point_index_in_frame_ + first_interpolation_period_) %
                   interpolation_period_)) {
    // Interpolate adjacent data.
    std::transform(curr_data_.begin(), curr_data_.end(), increment_.begin(),
                   curr_data_.begin(), std::plus<double>());
  } else if (0 == interpolation_period_ &&
             frame_period_ / 2 == point_index_in_frame_) {
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
  }

  return true;
}